

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

Object * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Object>
          (Structure *this,shared_ptr<Assimp::Blender::Object> *out,size_t *s)

{
  Object *this_00;
  __shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (Object *)operator_new(0x568);
  Object::Object(this_00);
  ::std::__shared_ptr<Assimp::Blender::Object,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::Object,void>
            ((__shared_ptr<Assimp::Blender::Object,(__gnu_cxx::_Lock_policy)2> *)&local_30,this_00);
  ::std::__shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>,&local_30
            );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }